

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void compact_array_suite::test_int16(void)

{
  undefined4 local_c4;
  array<short,_4UL> value;
  value_type input [10];
  iarchive in;
  
  input[0] = 0xaa;
  input[1] = '\b';
  input[2] = '\x01';
  input[3] = '\x11';
  input[4] = '\x02';
  input[5] = '\x12';
  input[6] = '\x03';
  input[7] = '\x13';
  input[8] = '\x04';
  input[9] = '\x14';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[10]>(&in,&input);
  value._M_elems[0] = 0x7fff;
  value._M_elems[1] = 0x7fff;
  value._M_elems[2] = 0x7fff;
  value._M_elems[3] = 0x7fff;
  trial::protocol::bintoken::iarchive::load_override<std::array<short,4ul>>(&in,&value);
  local_c4 = 0x1101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[0]","INT16_C(0x1101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x79,"void compact_array_suite::test_int16()",&value,&local_c4);
  local_c4 = 0x1202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[1]","INT16_C(0x1202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7a,"void compact_array_suite::test_int16()",value._M_elems + 1,&local_c4);
  local_c4 = 0x1303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[2]","INT16_C(0x1303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7b,"void compact_array_suite::test_int16()",value._M_elems + 2,&local_c4);
  local_c4 = 0x1404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[3]","INT16_C(0x1404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7c,"void compact_array_suite::test_int16()",value._M_elems + 3,&local_c4);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_int16()
{
    const value_type input[] = { token::code::array8_int16, 4 * token::int16::size,
                                 0x01, 0x11,
                                 0x02, 0x12,
                                 0x03, 0x13,
                                 0x04, 0x14 };
    format::iarchive in(input);
    std::array<std::int16_t, 4> value = {{ std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT16_C(0x1101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT16_C(0x1202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT16_C(0x1303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT16_C(0x1404));
}